

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_attachment_record
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  uint64_t *puVar1;
  ModuleParseContext *this_00;
  char *pcVar2;
  MDOperand *md;
  MDNode *node;
  LoggingCallback p_Var3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  size_t sStack_1060;
  ThreadLocalAllocator<char> local_1049;
  ModuleParseContext *local_1048;
  Instruction *local_1040;
  char buffer [4096];
  
  if (entry->id != 0xb) {
    return true;
  }
  puVar1 = (entry->ops).
           super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar5 = (long)(entry->ops).
                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar5 == 0) {
    return false;
  }
  local_1048 = this;
  local_1040 = get_instruction(this,*puVar1);
  if (local_1040 == (Instruction *)0x0) {
    p_Var3 = dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      pcVar2 = "[ERROR]: Invalid instruction.\n";
      sStack_1060 = 0x1e;
LAB_001734bb:
      fwrite(pcVar2,sStack_1060,1,_stderr);
      fflush(_stderr);
      return false;
    }
    builtin_strncpy(buffer + 8,"instruction.\n",0xe);
  }
  else {
    uVar6 = (lVar5 >> 3) - 1U >> 1;
    lVar5 = 0;
    while( true ) {
      this_00 = local_1048;
      bVar7 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar7) {
        return true;
      }
      pcVar2 = get_metadata_kind(local_1048,
                                 *(uint64_t *)
                                  ((long)(entry->ops).
                                         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar5 + 8));
      md = get_metadata(this_00,*(uint64_t *)
                                 ((long)(entry->ops).
                                        super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + 0x10));
      node = dyn_cast<LLVMBC::MDNode>(md);
      if (pcVar2 == (char *)0x0) break;
      if (node == (MDNode *)0x0) {
        p_Var3 = dxil_spv::get_thread_log_callback();
        if (p_Var3 == (LoggingCallback)0x0) {
          pcVar2 = "[ERROR]: Invalid metadata attachment.\n";
          sStack_1060 = 0x26;
          goto LAB_001734bb;
        }
        builtin_strncpy(buffer + 0x10," attachment.\n",0xe);
        builtin_strncpy(buffer + 8,"metadata",8);
        goto LAB_0017345a;
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)buffer,pcVar2,&local_1049);
      Instruction::setMetadata
                (local_1040,
                 (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)buffer,node);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)buffer);
      lVar5 = lVar5 + 0x10;
    }
    p_Var3 = dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      pcVar2 = "[ERROR]: Invalid metadata kind.\n";
      sStack_1060 = 0x20;
      goto LAB_001734bb;
    }
    builtin_strncpy(buffer + 8,"metadata kind.\n",0x10);
  }
LAB_0017345a:
  builtin_strncpy(buffer,"Invalid ",8);
  pvVar4 = dxil_spv::get_thread_log_callback_userdata();
  (*p_Var3)(pvVar4,Error,buffer);
  return false;
}

Assistant:

bool ModuleParseContext::parse_metadata_attachment_record(const BlockOrRecord &entry)
{
	if (MetaDataRecord(entry.id) != MetaDataRecord::ATTACHMENT)
		return true;

	if (entry.ops.size() < 1)
		return false;

	size_t size = entry.ops.size();
	size_t num_nodes = (size - 1) / 2;
	auto *inst = get_instruction(entry.ops[0]);

	if (!inst)
	{
		LOGE("Invalid instruction.\n");
		return false;
	}

	for (size_t i = 0; i < num_nodes; i++)
	{
		auto *kind = get_metadata_kind(entry.ops[2 * i + 1]);
		auto *operand = get_metadata(entry.ops[2 * i + 2]);
		auto *node = dyn_cast<MDNode>(operand);

		if (!kind)
		{
			LOGE("Invalid metadata kind.\n");
			return false;
		}

		if (!node)
		{
			LOGE("Invalid metadata attachment.\n");
			return false;
		}

		inst->setMetadata(kind, node);
	}
	return true;
}